

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

OptionBase<std::vector<bool,_std::allocator<bool>_>_> * __thiscall
Lib::OptionBase<std::vector<bool,_std::allocator<bool>_>_>::operator=
          (OptionBase<std::vector<bool,_std::allocator<bool>_>_> *this,
          OptionBase<std::vector<bool,_std::allocator<bool>_>_> *other)

{
  _Bit_pointer puVar1;
  undefined8 uVar2;
  ulong uVar3;
  _Bit_type *p_Var4;
  ulong uVar5;
  bool bVar6;
  _Bvector_base<std::allocator<bool>_> local_38;
  
  if (this->_isSome == true) {
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              ((_Bvector_base<std::allocator<bool>_> *)&this->_elem);
  }
  bVar6 = other->_isSome;
  if (bVar6 == true) {
    puVar1 = (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_end_of_storage;
    uVar2 = (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar3 = *(ulong *)((long)&(other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8
                      );
    p_Var4 = (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
    uVar5 = *(ulong *)((long)&(other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>.
                              _M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base +
                      8);
    (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined4 *)((long)&(other->_elem)._elem + 8) = 0;
    (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    *(undefined4 *)((long)&(other->_elem)._elem + 0x18) = 0;
    (other->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    (this->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_end_of_storage = puVar1;
    (this->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var4;
    *(ulong *)((long)&(this->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base + 8) = uVar5;
    (this->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)uVar2;
    *(ulong *)((long)&(this->_elem)._elem.init.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base + 8) = uVar3;
    local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_38._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
         uVar3 & 0xffffffff00000000;
    local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p =
         (_Bit_type *)0x0;
    local_38._M_impl.super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ =
         uVar5 & 0xffffffff00000000;
    local_38._M_impl.super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_38);
    bVar6 = other->_isSome;
  }
  this->_isSome = bVar6;
  return this;
}

Assistant:

OptionBase& operator=(OptionBase&& other)
  {
    if (_isSome) {
      unwrap().~A();
    }
    if (other._isSome) {
      _elem.init(move_if_value<A>(other.unwrap()));
    }
    _isSome = other._isSome;
    return *this;
  }